

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Labels.cpp
# Opt level: O2

void __thiscall Labels::displayArrays(Labels *this)

{
  ostream *poVar1;
  uint i;
  ulong uVar2;
  string *psVar3;
  
  poVar1 = std::operator<<((ostream *)&std::cerr," Current size ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  psVar3 = labels_string_abi_cxx11_;
  for (uVar2 = 0; uVar2 < current_size; uVar2 = uVar2 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"String : ");
    poVar1 = std::operator<<(poVar1,(string *)psVar3);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cerr,"Counter : ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cerr,"Activated: ");
    poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    std::endl<char,std::char_traits<char>>(poVar1);
    psVar3 = psVar3 + 1;
  }
  return;
}

Assistant:

void Labels::displayArrays(){
    cerr << " Current size " << current_size << endl;
    for(unsigned int i=0;i<current_size;i++){
        cerr << "String : " << labels_string[i]   << endl;
        cerr << "Counter : " << labels_counter[i]  << endl;
        cerr << "Activated: " << labels_activated[i]<< endl;
    }
}